

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O0

version_constant __thiscall setup::version::next(version *this)

{
  flags<setup::file_entry::flags_Enum_,_33UL> o;
  flags<setup::file_entry::flags_Enum_,_33UL> o_00;
  type pkVar1;
  type __first;
  known_version *pkVar2;
  known_version *result;
  known_version *end;
  known_legacy_version *legacy_result;
  known_legacy_version *legacy_end;
  flags<setup::file_entry::flags_Enum_,_33UL> *in_stack_ffffffffffffffa8;
  uint6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  bool bVar3;
  undefined1 uVar4;
  uint *in_stack_ffffffffffffffc0;
  known_version *in_stack_ffffffffffffffc8;
  known_legacy_version *in_stack_ffffffffffffffd0;
  type local_20;
  version_constant local_4;
  
  pkVar1 = boost::range_adl_barrier::end<setup::(anonymous_namespace)::known_legacy_version[2]>
                     ((known_legacy_version (*) [2])0x18b9af);
  boost::range_adl_barrier::begin<setup::(anonymous_namespace)::known_legacy_version[2]>
            ((known_legacy_version (*) [2])0x18b9c0);
  local_20 = std::
             upper_bound<setup::(anonymous_namespace)::known_legacy_version_const*,unsigned_int>
                       (in_stack_ffffffffffffffd0,(known_legacy_version *)in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffc0);
  while( true ) {
    uVar4 = false;
    if (local_20 != pkVar1) {
      o._flags.super__Base_bitset<1UL>._M_w._6_1_ = in_stack_ffffffffffffffb6;
      o._flags.super__Base_bitset<1UL>._M_w._0_6_ = in_stack_ffffffffffffffb0;
      o._flags.super__Base_bitset<1UL>._M_w._7_1_ = 0;
      uVar4 = flags<setup::file_entry::flags_Enum_,_33UL>::operator!=(in_stack_ffffffffffffffa8,o);
    }
    if ((bool)uVar4 == false) break;
    local_20 = local_20 + 1;
  }
  if (local_20 == pkVar1) {
    __first = boost::range_adl_barrier::end<setup::(anonymous_namespace)::known_version[114]>
                        ((known_version (*) [114])0x18ba51);
    boost::range_adl_barrier::begin<setup::(anonymous_namespace)::known_version[114]>
              ((known_version (*) [114])0x18ba62);
    pkVar2 = std::upper_bound<setup::(anonymous_namespace)::known_version_const*,unsigned_int>
                       (__first,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    while( true ) {
      bVar3 = false;
      if (pkVar2 != __first) {
        o_00._flags.super__Base_bitset<1UL>._M_w._7_1_ = uVar4;
        o_00._flags.super__Base_bitset<1UL>._M_w._0_7_ = (uint7)in_stack_ffffffffffffffb0;
        bVar3 = flags<setup::file_entry::flags_Enum_,_33UL>::operator!=
                          (in_stack_ffffffffffffffa8,o_00);
      }
      if (bVar3 == false) break;
      pkVar2 = pkVar2 + 1;
    }
    if (pkVar2 == __first) {
      local_4 = 0;
    }
    else {
      local_4 = pkVar2->version;
    }
  }
  else {
    local_4 = local_20->version;
  }
  return local_4;
}

Assistant:

version_constant version::next() {
	
	const known_legacy_version * legacy_end = boost::end(legacy_versions);
	const known_legacy_version * legacy_result;
	legacy_result = std::upper_bound(boost::begin(legacy_versions), legacy_end, value);
	while(legacy_result != legacy_end && legacy_result->variant != variant) {
		legacy_result++;
	}
	if(legacy_result != legacy_end) {
		return legacy_result->version;
	}
	 
	const known_version * end = boost::end(versions);
	const known_version * result = std::upper_bound(boost::begin(versions), end, value);
	while(result != end && result->variant != variant) {
		result++;
	}
	if(result != end) {
		return result->version;
	}
	
	return 0;
}